

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::Configure(cmake *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
  *this_00;
  mapped_type mVar1;
  cmState *pcVar2;
  cmMessenger *pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  char *pcVar9;
  char *pcVar10;
  byte bVar11;
  bool b;
  bool b_00;
  allocator<char> local_49;
  key_type local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"deprecated",&local_49);
  this_00 = &this->DiagLevels;
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
          ::count(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (sVar7 == 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"deprecated",&local_49);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
             ::operator[](this_00,&local_48);
    mVar1 = *pmVar8;
    std::__cxx11::string::~string((string *)&local_48);
    if (mVar1 < (DIAG_ERROR|DIAG_WARN)) {
      bVar11 = (byte)mVar1 & 7;
      SetSuppressDeprecatedWarnings(this,(bool)(1 >> bVar11));
      SetDeprecatedWarningsAsErrors(this,(bool)(4U >> bVar11 & 1));
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"dev",&local_49);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
          ::count(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (sVar7 != 1) goto LAB_00179177;
  pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_WARN_DEPRECATED",&local_49);
  pcVar9 = cmState::GetCacheEntryValue(pcVar2,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_ERROR_DEPRECATED",&local_49);
  pcVar10 = cmState::GetCacheEntryValue(pcVar2,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  bVar5 = pcVar9 != (char *)0x0;
  bVar4 = pcVar10 != (char *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"dev",&local_49);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
           ::operator[](this_00,&local_48);
  mVar1 = *pmVar8;
  std::__cxx11::string::~string((string *)&local_48);
  if (mVar1 == DIAG_ERROR) {
    b = false;
    SetSuppressDevWarnings(this,false);
    SetDevWarningsAsErrors(this,true);
    if (bVar5 || bVar4) goto LAB_00179177;
    b_00 = true;
  }
  else if (mVar1 == DIAG_WARN) {
    b = false;
    SetSuppressDevWarnings(this,false);
    SetDevWarningsAsErrors(this,false);
    b_00 = false;
    if (bVar5 || bVar4) goto LAB_00179177;
  }
  else {
    if (mVar1 != DIAG_IGNORE) goto LAB_00179177;
    SetSuppressDevWarnings(this,true);
    b_00 = false;
    SetDevWarningsAsErrors(this,false);
    if (bVar5 || bVar4) goto LAB_00179177;
    b = true;
  }
  SetSuppressDeprecatedWarnings(this,b);
  SetDeprecatedWarningsAsErrors(this,b_00);
LAB_00179177:
  pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_WARN_DEPRECATED",&local_49);
  pcVar9 = cmState::GetCacheEntryValue(pcVar2,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pcVar3 = (this->Messenger)._M_t.
           super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
           super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
           super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
  if (pcVar9 == (char *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = cmSystemTools::IsOff(pcVar9);
  }
  pcVar3->SuppressDeprecatedWarnings = bVar5;
  pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_ERROR_DEPRECATED",&local_49);
  pcVar9 = cmState::GetCacheEntryValue(pcVar2,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pcVar3 = (this->Messenger)._M_t.
           super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
           super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
           super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
  bVar5 = cmSystemTools::IsOn(pcVar9);
  pcVar3->DeprecatedWarningsAsErrors = bVar5;
  pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_49);
  pcVar9 = cmState::GetCacheEntryValue(pcVar2,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pcVar3 = (this->Messenger)._M_t.
           super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
           super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
           super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
  bVar5 = cmSystemTools::IsOn(pcVar9);
  pcVar3->SuppressDevWarnings = bVar5;
  pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",&local_49);
  pcVar9 = cmState::GetCacheEntryValue(pcVar2,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pcVar3 = (this->Messenger)._M_t.
           super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
           super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
           super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
  if (pcVar9 == (char *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = cmSystemTools::IsOff(pcVar9);
  }
  pcVar3->DevWarningsAsErrors = bVar5;
  iVar6 = ActualConfigure(this);
  pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_49);
  pcVar9 = cmState::GetGlobalProperty(pcVar2,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,pcVar9,&local_49);
    iVar6 = HandleDeleteCacheVariables(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return iVar6;
}

Assistant:

int cmake::Configure()
{
  DiagLevel diagLevel;

  if (this->DiagLevels.count("deprecated") == 1) {

    diagLevel = this->DiagLevels["deprecated"];
    if (diagLevel == DIAG_IGNORE) {
      this->SetSuppressDeprecatedWarnings(true);
      this->SetDeprecatedWarningsAsErrors(false);
    } else if (diagLevel == DIAG_WARN) {
      this->SetSuppressDeprecatedWarnings(false);
      this->SetDeprecatedWarningsAsErrors(false);
    } else if (diagLevel == DIAG_ERROR) {
      this->SetSuppressDeprecatedWarnings(false);
      this->SetDeprecatedWarningsAsErrors(true);
    }
  }

  if (this->DiagLevels.count("dev") == 1) {
    bool setDeprecatedVariables = false;

    const char* cachedWarnDeprecated =
      this->State->GetCacheEntryValue("CMAKE_WARN_DEPRECATED");
    const char* cachedErrorDeprecated =
      this->State->GetCacheEntryValue("CMAKE_ERROR_DEPRECATED");

    // don't overwrite deprecated warning setting from a previous invocation
    if (!cachedWarnDeprecated && !cachedErrorDeprecated) {
      setDeprecatedVariables = true;
    }

    diagLevel = this->DiagLevels["dev"];
    if (diagLevel == DIAG_IGNORE) {
      this->SetSuppressDevWarnings(true);
      this->SetDevWarningsAsErrors(false);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(true);
        this->SetDeprecatedWarningsAsErrors(false);
      }
    } else if (diagLevel == DIAG_WARN) {
      this->SetSuppressDevWarnings(false);
      this->SetDevWarningsAsErrors(false);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(false);
        this->SetDeprecatedWarningsAsErrors(false);
      }
    } else if (diagLevel == DIAG_ERROR) {
      this->SetSuppressDevWarnings(false);
      this->SetDevWarningsAsErrors(true);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(false);
        this->SetDeprecatedWarningsAsErrors(true);
      }
    }
  }

  // Cache variables may have already been set by a previous invocation,
  // so we cannot rely on command line options alone. Always ensure our
  // messenger is in sync with the cache.
  const char* value = this->State->GetCacheEntryValue("CMAKE_WARN_DEPRECATED");
  this->Messenger->SetSuppressDeprecatedWarnings(value &&
                                                 cmSystemTools::IsOff(value));

  value = this->State->GetCacheEntryValue("CMAKE_ERROR_DEPRECATED");
  this->Messenger->SetDeprecatedWarningsAsErrors(cmSystemTools::IsOn(value));

  value = this->State->GetCacheEntryValue("CMAKE_SUPPRESS_DEVELOPER_WARNINGS");
  this->Messenger->SetSuppressDevWarnings(cmSystemTools::IsOn(value));

  value = this->State->GetCacheEntryValue("CMAKE_SUPPRESS_DEVELOPER_ERRORS");
  this->Messenger->SetDevWarningsAsErrors(value &&
                                          cmSystemTools::IsOff(value));

  int ret = this->ActualConfigure();
  const char* delCacheVars =
    this->State->GetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_");
  if (delCacheVars && delCacheVars[0] != 0) {
    return this->HandleDeleteCacheVariables(delCacheVars);
  }
  return ret;
}